

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsPosixFileReader.cpp
# Opt level: O2

void __thiscall xs::posix::FileReader::run(FileReader *this)

{
  deFileResult dVar1;
  deInt64 *__n;
  deInt64 numRead;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpBuf;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&tmpBuf,0x400,(allocator_type *)&numRead);
  numRead = 0;
  while ((this->m_buf).m_canceled == 0) {
    __n = &numRead;
    dVar1 = deFile_read(this->m_file,
                        tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)tmpBuf.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)tmpBuf.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,&numRead);
    if (dVar1 == DE_FILERESULT_SUCCESS) {
      de::BlockBuffer<unsigned_char>::write
                (&this->m_buf,(int)numRead,
                 tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,(size_t)__n);
      de::BlockBuffer<unsigned_char>::flush(&this->m_buf);
    }
    else {
      if (DE_FILERESULT_WOULD_BLOCK < dVar1) break;
      deSleep(100);
    }
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void FileReader::run (void)
{
	std::vector<deUint8>	tmpBuf		(FILEREADER_TMP_BUFFER_SIZE);
	deInt64					numRead		= 0;

	while (!m_buf.isCanceled())
	{
		deFileResult result = deFile_read(m_file, &tmpBuf[0], (deInt64)tmpBuf.size(), &numRead);

		if (result == DE_FILERESULT_SUCCESS)
		{
			// Write to buffer.
			try
			{
				m_buf.write((int)numRead, &tmpBuf[0]);
				m_buf.flush();
			}
			catch (const ThreadedByteBuffer::CanceledException&)
			{
				// Canceled.
				break;
			}
		}
		else if (result == DE_FILERESULT_END_OF_FILE ||
				 result == DE_FILERESULT_WOULD_BLOCK)
		{
			// Wait for more data.
			deSleep(FILEREADER_IDLE_SLEEP);
		}
		else
			break; // Error.
	}
}